

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void delete_list(void)

{
  node *pnVar1;
  node *__ptr;
  
  __ptr = first;
  if (first != (node *)0x0) {
    do {
      pnVar1 = __ptr->next;
      free(__ptr);
      __ptr = pnVar1;
    } while (pnVar1 != (node *)0x0);
  }
  first = (node *)0x0;
  return;
}

Assistant:

void delete_list() {
    struct node *temp;
    struct node *node = first;
    while (node != NULL) {
        temp = node;
        node = node->next;
        free(temp);
    }
    first = NULL;
}